

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O2

void __thiscall
flatbuffers::swift::SwiftGenerator::BuildObjectAPIConstructorBody
          (SwiftGenerator *this,FieldDef *field,bool is_fixed,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *buffer_constructor,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *base_constructor)

{
  uint uVar1;
  Value *type_00;
  CodeWriter *this_00;
  BaseType BVar2;
  EnumDef *pEVar3;
  StructDef *pSVar4;
  byte bVar5;
  char *__s;
  char *__s_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  char *__s_01;
  bool bVar7;
  string default_value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  string nullable;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_1e8;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_1e0;
  allocator<char> local_1d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  string field_var;
  string is_required;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  string field_field;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string type;
  
  local_1e8 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)base_constructor;
  local_1e0 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
              buffer_constructor;
  (*(this->namer_).super_Namer._vptr_Namer[0x12])(&field_field,&this->namer_,field);
  (*(this->namer_).super_Namer._vptr_Namer[7])(&field_var,&this->namer_,field);
  type_00 = &field->value;
  GenType_abi_cxx11_(&type,this,&type_00->type,false);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&is_required,"FIELDVAR",(allocator<char> *)&nullable);
  this_00 = &this->code_;
  CodeWriter::SetValue(this_00,&is_required,&field_field);
  std::__cxx11::string::~string((string *)&is_required);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&is_required,"VALUETYPE",(allocator<char> *)&nullable);
  CodeWriter::SetValue(this_00,&is_required,&type);
  std::__cxx11::string::~string((string *)&is_required);
  __s = "";
  __s_01 = "?";
  __s_00 = "?";
  if (field->presence == kRequired) {
    __s_00 = "";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&is_required,__s_00,(allocator<char> *)&nullable);
  BVar2 = (type_00->type).base_type;
  switch(BVar2) {
  case BASE_TYPE_STRING:
    std::operator+(&local_b0,"{{ACCESS_TYPE}} var {{FIELDVAR}}: String",&is_required);
    CodeWriter::operator+=(this_00,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::operator+(&default_value,&field_var," = _t.");
    std::operator+(&nullable,&default_value,&field_field);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>(local_1e0,&nullable);
    std::__cxx11::string::~string((string *)&nullable);
    std::__cxx11::string::~string((string *)&default_value);
    if (field->presence == kDefault) {
      SwiftConstant_abi_cxx11_(&nullable,this,field);
      std::operator+(&local_208,&field_var," = \"");
      std::operator+(&local_248,&local_208,&nullable);
      std::operator+(&default_value,&local_248,"\"");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>(local_1e8,&default_value);
    }
    else {
      if (field->presence != kRequired) goto LAB_00221b8a;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&nullable,"",(allocator<char> *)&default_value);
      std::operator+(&local_208,&field_var," = \"");
      std::operator+(&local_248,&local_208,&nullable);
      std::operator+(&default_value,&local_248,"\"");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>(local_1e8,&default_value);
    }
    std::__cxx11::string::~string((string *)&default_value);
    std::__cxx11::string::~string((string *)&local_248);
    pbVar6 = &local_208;
    goto LAB_00221b7b;
  case BASE_TYPE_VECTOR:
  case BASE_TYPE_ARRAY:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&nullable,"    ",(allocator<char> *)&default_value);
    BuildObjectAPIConstructorBodyVectors
              (this,field,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_1e0,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_1e8,&nullable);
    break;
  case BASE_TYPE_STRUCT:
    GenType_abi_cxx11_(&nullable,this,&type_00->type,true);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&default_value,"VALUETYPE",(allocator<char> *)&local_248);
    CodeWriter::SetValue(this_00,&default_value,&nullable);
    std::__cxx11::string::~string((string *)&default_value);
    pSVar4 = (field->value).type.struct_def;
    if (pSVar4 == (StructDef *)0x0) {
      bVar5 = 0;
    }
    else {
      bVar5 = pSVar4->fixed;
    }
    if ((bVar5 & is_fixed & 1) != 0) {
      __s_01 = "";
    }
    if (field->presence == kRequired) {
      __s_01 = "";
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&default_value,__s_01,(allocator<char> *)&local_248);
    std::operator+(&local_70,"{{ACCESS_TYPE}} var {{FIELDVAR}}: {{VALUETYPE}}",&default_value);
    CodeWriter::operator+=(this_00,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::operator+(&local_170,"",&field_var);
    std::operator+(&local_1d0,&local_170," = ");
    std::operator+(&local_208,&local_1d0,&nullable);
    std::operator+(&local_248,&local_208,"()");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>(local_1e8,&local_248);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_170);
    if (((field->value).type.struct_def)->fixed == true) {
      std::operator+(&local_1d0,"",&field_var);
      std::operator+(&local_208,&local_1d0," = _t.");
      std::operator+(&local_248,&local_208,&field_field);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>(local_1e0,&local_248);
      std::__cxx11::string::~string((string *)&local_248);
      std::__cxx11::string::~string((string *)&local_208);
      pbVar6 = &local_1d0;
    }
    else {
      std::operator+(&local_1d0,"var __",&field_var);
      std::operator+(&local_208,&local_1d0," = _t.");
      std::operator+(&local_248,&local_208,&field_field);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>(local_1e0,&local_248);
      std::__cxx11::string::~string((string *)&local_248);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::operator+(&local_90,"",&field_var);
      std::operator+(&local_170,&local_90," = __");
      std::operator+(&local_1d0,&local_170,&field_var);
      if (field->presence == kRequired) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"!",&local_1d1);
      }
      else {
        std::__cxx11::string::string((string *)&local_130,(string *)&default_value);
      }
      std::operator+(&local_208,&local_1d0,&local_130);
      std::operator+(&local_248,&local_208,".unpack()");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>(local_1e0,&local_248);
      std::__cxx11::string::~string((string *)&local_248);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_170);
      pbVar6 = &local_90;
    }
LAB_00221b71:
    std::__cxx11::string::~string((string *)pbVar6);
    pbVar6 = &default_value;
LAB_00221b7b:
    std::__cxx11::string::~string((string *)pbVar6);
    break;
  case BASE_TYPE_UNION:
    pEVar3 = (field->value).type.enum_def;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&nullable,"",(allocator<char> *)&default_value);
    BuildUnionEnumSwitchCase
              (this,pEVar3,&field_var,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_1e0,&nullable,false);
    break;
  default:
    if (BVar2 == BASE_TYPE_UTYPE) goto LAB_00221b8a;
    std::operator+(&default_value,&field_var," = _t.");
    std::operator+(&nullable,&default_value,&field_field);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>(local_1e0,&nullable);
    std::__cxx11::string::~string((string *)&nullable);
    std::__cxx11::string::~string((string *)&default_value);
    if (field->presence == kOptional) {
      __s = "?";
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&nullable,__s,(allocator<char> *)&default_value);
    BVar2 = (field->value).type.base_type;
    uVar1 = BVar2 - BASE_TYPE_UTYPE;
    pEVar3 = (field->value).type.enum_def;
    bVar7 = pEVar3 != (EnumDef *)0x0;
    if ((BVar2 == BASE_TYPE_BOOL || 0xb < uVar1) ||
       (bVar7 = true, uVar1 < 10 && pEVar3 != (EnumDef *)0x0)) {
      if (!(bool)(bVar7 ^ 1U | 9 < uVar1)) {
        GenEnumDefaultValue_abi_cxx11_(&default_value,this,field);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f0,"{{ACCESS_TYPE}} var {{FIELDVAR}}: {{VALUETYPE}}",
                   (allocator<char> *)&local_248);
        CodeWriter::operator+=(this_00,&local_f0);
        std::__cxx11::string::~string((string *)&local_f0);
        std::operator+(&local_208,&field_var," = ");
        std::operator+(&local_248,&local_208,&default_value);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(local_1e8,&local_248);
        std::__cxx11::string::~string((string *)&local_248);
        pbVar6 = &local_208;
        goto LAB_00221b71;
      }
      if (BVar2 == BASE_TYPE_BOOL) {
        std::operator+(&local_110,"{{ACCESS_TYPE}} var {{FIELDVAR}}: Bool",&nullable);
        CodeWriter::operator+=(this_00,&local_110);
        std::__cxx11::string::~string((string *)&local_110);
        if (field->presence != kOptional) {
          std::operator+(&local_248,&field_var," = ");
          SwiftConstant_abi_cxx11_(&local_208,this,field);
          std::operator+(&default_value,&local_248,&local_208);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>(local_1e8,&default_value);
          goto LAB_00221ab0;
        }
      }
    }
    else {
      std::operator+(&local_d0,"{{ACCESS_TYPE}} var {{FIELDVAR}}: {{VALUETYPE}}",&nullable);
      CodeWriter::operator+=(this_00,&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      if (field->presence != kOptional) {
        std::operator+(&local_248,&field_var," = ");
        SwiftConstant_abi_cxx11_(&local_208,this,field);
        std::operator+(&default_value,&local_248,&local_208);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(local_1e8,&default_value);
LAB_00221ab0:
        std::__cxx11::string::~string((string *)&default_value);
        std::__cxx11::string::~string((string *)&local_208);
        pbVar6 = &local_248;
        goto LAB_00221b7b;
      }
    }
  }
  std::__cxx11::string::~string((string *)&nullable);
LAB_00221b8a:
  std::__cxx11::string::~string((string *)&is_required);
  std::__cxx11::string::~string((string *)&type);
  std::__cxx11::string::~string((string *)&field_var);
  std::__cxx11::string::~string((string *)&field_field);
  return;
}

Assistant:

void BuildObjectAPIConstructorBody(
      const FieldDef &field, bool is_fixed,
      std::vector<std::string> &buffer_constructor,
      std::vector<std::string> &base_constructor) {
    const auto field_field = namer_.Field(field);
    const auto field_var = namer_.Variable(field);
    const auto type = GenType(field.value.type);
    code_.SetValue("FIELDVAR", field_field);
    code_.SetValue("VALUETYPE", type);
    std::string is_required = field.IsRequired() ? "" : "?";

    switch (field.value.type.base_type) {
      case BASE_TYPE_STRUCT: {
        const auto objtype = GenType(field.value.type, true);
        code_.SetValue("VALUETYPE", objtype);
        const auto optional =
            (field.value.type.struct_def && field.value.type.struct_def->fixed);
        std::string question_mark =
            (field.IsRequired() || (optional && is_fixed) ? "" : "?");

        code_ +=
            "{{ACCESS_TYPE}} var {{FIELDVAR}}: {{VALUETYPE}}" + question_mark;
        base_constructor.push_back("" + field_var + " = " + objtype + "()");

        if (field.value.type.struct_def->fixed) {
          buffer_constructor.push_back("" + field_var + " = _t." + field_field);
        } else {
          buffer_constructor.push_back("var __" + field_var + " = _t." +
                                       field_field);
          buffer_constructor.push_back(
              "" + field_var + " = __" + field_var +
              (field.IsRequired() ? "!" : question_mark) + ".unpack()");
        }
        break;
      }
      case BASE_TYPE_ARRAY: FLATBUFFERS_FALLTHROUGH();
      case BASE_TYPE_VECTOR: {
        BuildObjectAPIConstructorBodyVectors(field, buffer_constructor,
                                             base_constructor, "    ");
        break;
      }
      case BASE_TYPE_STRING: {
        code_ += "{{ACCESS_TYPE}} var {{FIELDVAR}}: String" + is_required;
        buffer_constructor.push_back(field_var + " = _t." + field_field);

        if (field.IsRequired()) {
          std::string default_value =
              field.IsDefault() ? SwiftConstant(field) : "";
          base_constructor.push_back(field_var + " = \"" + default_value +
                                     "\"");
          break;
        }
        if (field.IsDefault() && !field.IsRequired()) {
          std::string value = field.IsDefault() ? SwiftConstant(field) : "nil";
          base_constructor.push_back(field_var + " = \"" + value + "\"");
        }
        break;
      }
      case BASE_TYPE_UTYPE: break;
      case BASE_TYPE_UNION: {
        BuildUnionEnumSwitchCase(*field.value.type.enum_def, field_var,
                                 buffer_constructor);
        break;
      }
      default: {
        buffer_constructor.push_back(field_var + " = _t." + field_field);
        std::string nullable = field.IsOptional() ? "?" : "";
        if (IsScalar(field.value.type.base_type) &&
            !IsBool(field.value.type.base_type) && !IsEnum(field.value.type)) {
          code_ += "{{ACCESS_TYPE}} var {{FIELDVAR}}: {{VALUETYPE}}" + nullable;
          if (!field.IsOptional())
            base_constructor.push_back(field_var + " = " +
                                       SwiftConstant(field));
          break;
        }

        if (IsEnum(field.value.type)) {
          const auto default_value = IsEnum(field.value.type)
                                         ? GenEnumDefaultValue(field)
                                         : SwiftConstant(field);
          code_ += "{{ACCESS_TYPE}} var {{FIELDVAR}}: {{VALUETYPE}}";
          base_constructor.push_back(field_var + " = " + default_value);
          break;
        }

        if (IsBool(field.value.type.base_type)) {
          code_ += "{{ACCESS_TYPE}} var {{FIELDVAR}}: Bool" + nullable;
          if (!field.IsOptional())
            base_constructor.push_back(field_var + " = " +
                                       SwiftConstant(field));
        }
      }
    }
  }